

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O2

INT Silent_AddPaddingVfprintf(PAL_FILE *stream,LPSTR In,INT Padding,INT Flags)

{
  int iVar1;
  errno_t eVar2;
  size_t sVar3;
  char *_Dst;
  INT IVar4;
  size_t sVar5;
  char *_Dst_00;
  int iVar6;
  bool bVar7;
  
  sVar3 = strlen(In);
  iVar6 = 0;
  if (0 < Padding) {
    iVar6 = Padding;
  }
  iVar1 = (int)sVar3;
  sVar5 = (size_t)(iVar1 + iVar6 + 1);
  _Dst = (char *)PAL_malloc(sVar5);
  if (_Dst == (char *)0x0) {
    return -1;
  }
  _Dst_00 = _Dst;
  if ((Flags & 1U) == 0) {
LAB_002cb55e:
    if (0 < Padding) {
      if ((Flags & 4U) == 0) {
        while (bVar7 = Padding != 0, Padding = Padding + -1, bVar7) {
          *_Dst_00 = ' ';
          _Dst_00 = _Dst_00 + 1;
        }
      }
      else {
        while (bVar7 = Padding != 0, Padding = Padding + -1, bVar7) {
          *_Dst_00 = '0';
          _Dst_00 = _Dst_00 + 1;
        }
      }
    }
    if (((Flags & 1U) != 0) || (eVar2 = strcpy_s(_Dst_00,sVar5,In), eVar2 == 0)) {
      sVar5 = PAL_fwrite(_Dst,1,(long)(iVar6 + iVar1),stream);
      IVar4 = -1;
      if (stream->PALferrorCode != 1) {
        IVar4 = (INT)sVar5;
      }
      goto LAB_002cb5c8;
    }
  }
  else {
    eVar2 = strcpy_s(_Dst,sVar5,In);
    if (eVar2 == 0) {
      _Dst_00 = _Dst + iVar1;
      goto LAB_002cb55e;
    }
  }
  IVar4 = -1;
LAB_002cb5c8:
  PAL_free(_Dst);
  return IVar4;
}

Assistant:

INT Silent_AddPaddingVfprintf(PAL_FILE *stream, LPSTR In, INT Padding, INT Flags)
{
    LPSTR Out;
    INT LengthInStr;
    INT Length;
    LPSTR OutOriginal;
    INT Written;

    LengthInStr = strlen(In);
    Length = LengthInStr;


    if (Padding > 0)
    {
        Length += Padding;
    }
    Out = (LPSTR) PAL_malloc(Length+1);
    int iLen = Length+1;
    if (!Out)
    {
        return -1;
    }
    OutOriginal = Out;

    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (strcpy_s(Out, iLen, In) != SAFECRT_SUCCESS)
        {
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLen -= LengthInStr;
    }
    if (Padding > 0)
    {
        iLen -= Padding;
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding--)
            {
                *Out++ = '0';
            }
        }
        else /* pad with spaces */
        {
            while (Padding--)
            {
                *Out++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (strcpy_s(Out, Length+1, In) != SAFECRT_SUCCESS)
        {
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLen -= LengthInStr;
    }

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr((FILE*)stream);
#endif

    Written = PAL_fwrite(OutOriginal, 1, Length, stream);
    if (stream->PALferrorCode == PAL_FILE_ERROR)
    {
        Written = -1;
    }

Done:
    PAL_free(OutOriginal);
    return Written;
}